

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O1

void __thiscall
TEST_DoublingFactorCounterTest_AllTerminalsAndHornors_SevenPairs_Test::
~TEST_DoublingFactorCounterTest_AllTerminalsAndHornors_SevenPairs_Test
          (TEST_DoublingFactorCounterTest_AllTerminalsAndHornors_SevenPairs_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupDoublingFactorCounterTest_001d4d20;
  std::
  _Rb_tree<mahjong::Tile,_mahjong::Tile,_std::_Identity<mahjong::Tile>,_std::less<mahjong::Tile>,_std::allocator<mahjong::Tile>_>
  ::~_Rb_tree(&(this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).s.bonus_tiles._M_t);
  std::vector<mahjong::Meld,_std::allocator<mahjong::Meld>_>::~vector
            (&(this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).h.melds);
  std::
  _Rb_tree<mahjong::Tile,_mahjong::Tile,_std::_Identity<mahjong::Tile>,_std::less<mahjong::Tile>,_std::allocator<mahjong::Tile>_>
  ::~_Rb_tree(&(this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).h.tiles._M_t);
  Utest::~Utest((Utest *)this);
  operator_delete(this,0xc0);
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, AllTerminalsAndHornors_SevenPairs)
{
	addPair(Tile::OneOfCharacters);
	addPair(Tile::NineOfCharacters);
	addPair(Tile::OneOfCircles);
	addPair(Tile::NineOfCircles);
	addPair(Tile::NineOfBamboos);
	addPair(Tile::WhiteDragon);
	addPair(Tile::WestWind);

	s.winByDiscard();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::AllTerminalsAndHornors));
	CHECK_EQUAL(1, r.patterns.count(Pattern::SevenPairs));
	CHECK_EQUAL(0, r.patterns.count(Pattern::TerminalOrHonorInEachSet));
	CHECK_EQUAL(4, r.doubling_factor);
}